

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnStoreExpr
          (ExprVisitorDelegate *this,StoreExpr *expr)

{
  WatWriter *this_00;
  bool bVar1;
  LoadStoreExpr<(wabt::ExprType)44> *pLVar2;
  char *s;
  
  this_00 = this->writer_;
  pLVar2 = cast<wabt::LoadStoreExpr<(wabt::ExprType)44>,wabt::Expr>((Expr *)expr);
  s = Opcode::GetName(&pLVar2->opcode);
  WritePutsSpace(this_00,s);
  if (pLVar2->offset != 0) {
    Writef(this_00,"offset=%u");
  }
  bVar1 = Opcode::IsNaturallyAligned(&pLVar2->opcode,pLVar2->align);
  if (!bVar1) {
    Writef(this_00,"align=%u",(ulong)pLVar2->align);
  }
  WriteNewline(this_00,false);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnStoreExpr(StoreExpr* expr) {
  writer_->WriteLoadStoreExpr<StoreExpr>(expr);
  return Result::Ok;
}